

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
::_add_bar(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
           *this,Dimension dim)

{
  Pos_index *pPVar1;
  _List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_> local_28;
  Dimension local_1c;
  
  pPVar1 = &(this->super_Chain_pairing_option).nextPosition_;
  local_28._M_node._0_4_ = 0xffffffff;
  local_1c = dim;
  std::__cxx11::
  list<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
  ::emplace_back<unsigned_int&,unsigned_int,int&>
            ((list<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
              *)&this->super_Chain_pairing_option,pPVar1,(uint *)&local_28,&local_1c);
  local_28._M_node =
       (this->super_Chain_pairing_option).barcode_.
       super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
       ._M_impl._M_node.super__List_node_base._M_prev;
  std::
  unordered_map<unsigned_int,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>>
  ::
  try_emplace<std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>&>
            ((unordered_map<unsigned_int,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>>
              *)&(this->super_Chain_pairing_option).indexToBar_,pPVar1,&local_28);
  pPVar1 = &(this->super_Chain_pairing_option).nextPosition_;
  *pPVar1 = *pPVar1 + 1;
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::_add_bar(Dimension dim)
{
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    _barcode().emplace_back(_nextPosition(), Master_matrix::template get_null_value<Pos_index>(), dim);
    if constexpr (Master_matrix::Option_list::has_removable_columns) {
      _indexToBar().try_emplace(_nextPosition(), --_barcode().end());
    } else {
      _indexToBar().push_back(_barcode().size() - 1);
    }
    ++_nextPosition();
  }
}